

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

Polynomial *
parsePolynomial(Polynomial *__return_storage_ptr__,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,int numstates,string *str)

{
  PolynomialParser P;
  string sStack_a8;
  PolynomialParser local_88;
  
  translateOperatorNames(&sStack_a8,str,numstates);
  PolynomialParser::PolynomialParser(&local_88,varnames,numstates,&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  PolynomialParser::value(__return_storage_ptr__,&local_88);
  PolynomialParser::~PolynomialParser(&local_88);
  return __return_storage_ptr__;
}

Assistant:

Polynomial parsePolynomial(const std::vector<std::string>& varnames, int numstates, const std::string& str)
{
  PolynomialParser P(varnames, numstates, translateOperatorNames(str, numstates));
  return P.value();
}